

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

char * nghttp2_strerror(int error_code)

{
  char *pcStack_10;
  int error_code_local;
  
  if (error_code == -0x388) {
    pcStack_10 = "Flooding was detected in this HTTP/2 session, and it must be closed";
  }
  else if (error_code == -0x387) {
    pcStack_10 = "Received bad client magic byte string";
  }
  else if (error_code == -0x386) {
    pcStack_10 = "The user callback function failed";
  }
  else if (error_code == -0x385) {
    pcStack_10 = "Out of memory";
  }
  else if (error_code == -0x219) {
    pcStack_10 = "SETTINGS frame contained more than the maximum allowed entries";
  }
  else if (error_code == -0x218) {
    pcStack_10 = 
    "When a local endpoint expects to receive SETTINGS frame, it receives an other type of frame";
  }
  else if (error_code == -0x217) {
    pcStack_10 = "Cancel";
  }
  else if (error_code == -0x216) {
    pcStack_10 = "Internal error";
  }
  else if (error_code == -0x215) {
    pcStack_10 = "Stream was refused";
  }
  else if (error_code == -0x214) {
    pcStack_10 = "Violation in HTTP messaging rule";
  }
  else if (error_code == -0x213) {
    pcStack_10 = "Invalid HTTP header field was received";
  }
  else if (error_code == -0x212) {
    pcStack_10 = "The current session is closing";
  }
  else if (error_code == -0x211) {
    pcStack_10 = "DATA or HEADERS frame has already been submitted for the stream";
  }
  else if (error_code == -0x210) {
    pcStack_10 = "Server push is disabled by peer";
  }
  else if (error_code == -0x20f) {
    pcStack_10 = "Too many inflight SETTINGS";
  }
  else if (error_code == -0x20e) {
    pcStack_10 = "Callback was paused by the application";
  }
  else if (error_code == -0x20d) {
    pcStack_10 = "Insufficient buffer size given to function";
  }
  else if (error_code == -0x20c) {
    pcStack_10 = "Flow control error";
  }
  else if (error_code == -0x20b) {
    pcStack_10 = "Header compression/decompression error";
  }
  else if (error_code == -0x20a) {
    pcStack_10 = "The length of the frame is invalid";
  }
  else if (error_code == -0x209) {
    pcStack_10 = "The user callback function failed due to the temporal error";
  }
  else if (error_code == -0x207) {
    pcStack_10 = "Invalid state";
  }
  else if (error_code == -0x206) {
    pcStack_10 = "Invalid header block";
  }
  else if (error_code == -0x205) {
    pcStack_10 = "GOAWAY has already been sent";
  }
  else if (error_code == -0x204) {
    pcStack_10 = "request HEADERS is not allowed";
  }
  else if (error_code == -0x203) {
    pcStack_10 = "Another DATA frame has already been deferred";
  }
  else if (error_code == -0x202) {
    pcStack_10 = "Invalid stream state";
  }
  else if (error_code == -0x201) {
    pcStack_10 = "Stream ID is invalid";
  }
  else if (error_code == -0x200) {
    pcStack_10 = "The transmission is not allowed for this stream";
  }
  else if (error_code == -0x1ff) {
    pcStack_10 = "Stream is closing";
  }
  else if (error_code == -0x1fe) {
    pcStack_10 = "Stream was already closed or invalid";
  }
  else if (error_code == -0x1fd) {
    pcStack_10 = "No more Stream ID available";
  }
  else if (error_code == -0x1fc) {
    pcStack_10 = "Data transfer deferred";
  }
  else if (error_code == -0x1fb) {
    pcStack_10 = "EOF";
  }
  else if (error_code == -0x1fa) {
    pcStack_10 = "Invalid frame octets";
  }
  else if (error_code == -0x1f9) {
    pcStack_10 = "Protocol error";
  }
  else if (error_code == -0x1f8) {
    pcStack_10 = "Operation would block";
  }
  else if (error_code == -0x1f7) {
    pcStack_10 = "Unsupported SPDY version";
  }
  else if (error_code == -0x1f6) {
    pcStack_10 = "Out of buffer space";
  }
  else if (error_code == -0x1f5) {
    pcStack_10 = "Invalid argument";
  }
  else if (error_code == 0) {
    pcStack_10 = "Success";
  }
  else {
    pcStack_10 = "Unknown error code";
  }
  return pcStack_10;
}

Assistant:

const char *nghttp2_strerror(int error_code) {
  switch (error_code) {
  case 0:
    return "Success";
  case NGHTTP2_ERR_INVALID_ARGUMENT:
    return "Invalid argument";
  case NGHTTP2_ERR_BUFFER_ERROR:
    return "Out of buffer space";
  case NGHTTP2_ERR_UNSUPPORTED_VERSION:
    return "Unsupported SPDY version";
  case NGHTTP2_ERR_WOULDBLOCK:
    return "Operation would block";
  case NGHTTP2_ERR_PROTO:
    return "Protocol error";
  case NGHTTP2_ERR_INVALID_FRAME:
    return "Invalid frame octets";
  case NGHTTP2_ERR_EOF:
    return "EOF";
  case NGHTTP2_ERR_DEFERRED:
    return "Data transfer deferred";
  case NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE:
    return "No more Stream ID available";
  case NGHTTP2_ERR_STREAM_CLOSED:
    return "Stream was already closed or invalid";
  case NGHTTP2_ERR_STREAM_CLOSING:
    return "Stream is closing";
  case NGHTTP2_ERR_STREAM_SHUT_WR:
    return "The transmission is not allowed for this stream";
  case NGHTTP2_ERR_INVALID_STREAM_ID:
    return "Stream ID is invalid";
  case NGHTTP2_ERR_INVALID_STREAM_STATE:
    return "Invalid stream state";
  case NGHTTP2_ERR_DEFERRED_DATA_EXIST:
    return "Another DATA frame has already been deferred";
  case NGHTTP2_ERR_START_STREAM_NOT_ALLOWED:
    return "request HEADERS is not allowed";
  case NGHTTP2_ERR_GOAWAY_ALREADY_SENT:
    return "GOAWAY has already been sent";
  case NGHTTP2_ERR_INVALID_HEADER_BLOCK:
    return "Invalid header block";
  case NGHTTP2_ERR_INVALID_STATE:
    return "Invalid state";
  case NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE:
    return "The user callback function failed due to the temporal error";
  case NGHTTP2_ERR_FRAME_SIZE_ERROR:
    return "The length of the frame is invalid";
  case NGHTTP2_ERR_HEADER_COMP:
    return "Header compression/decompression error";
  case NGHTTP2_ERR_FLOW_CONTROL:
    return "Flow control error";
  case NGHTTP2_ERR_INSUFF_BUFSIZE:
    return "Insufficient buffer size given to function";
  case NGHTTP2_ERR_PAUSE:
    return "Callback was paused by the application";
  case NGHTTP2_ERR_TOO_MANY_INFLIGHT_SETTINGS:
    return "Too many inflight SETTINGS";
  case NGHTTP2_ERR_PUSH_DISABLED:
    return "Server push is disabled by peer";
  case NGHTTP2_ERR_DATA_EXIST:
    return "DATA or HEADERS frame has already been submitted for the stream";
  case NGHTTP2_ERR_SESSION_CLOSING:
    return "The current session is closing";
  case NGHTTP2_ERR_HTTP_HEADER:
    return "Invalid HTTP header field was received";
  case NGHTTP2_ERR_HTTP_MESSAGING:
    return "Violation in HTTP messaging rule";
  case NGHTTP2_ERR_REFUSED_STREAM:
    return "Stream was refused";
  case NGHTTP2_ERR_INTERNAL:
    return "Internal error";
  case NGHTTP2_ERR_CANCEL:
    return "Cancel";
  case NGHTTP2_ERR_SETTINGS_EXPECTED:
    return "When a local endpoint expects to receive SETTINGS frame, it "
           "receives an other type of frame";
  case NGHTTP2_ERR_NOMEM:
    return "Out of memory";
  case NGHTTP2_ERR_CALLBACK_FAILURE:
    return "The user callback function failed";
  case NGHTTP2_ERR_BAD_CLIENT_MAGIC:
    return "Received bad client magic byte string";
  case NGHTTP2_ERR_FLOODED:
    return "Flooding was detected in this HTTP/2 session, and it must be "
           "closed";
  case NGHTTP2_ERR_TOO_MANY_SETTINGS:
    return "SETTINGS frame contained more than the maximum allowed entries";
  default:
    return "Unknown error code";
  }
}